

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O3

int __thiscall
xercesc_4_0::BMPattern::matches(BMPattern *this,XMLCh *content,XMLSize_t start,XMLSize_t limit)

{
  ulong uVar1;
  short *psVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  size_t __n;
  long lVar5;
  long lVar6;
  ArrayJanitor<char16_t> janUCContent;
  ArrayJanitor<char16_t> local_40;
  XMLCh *toUpperCase;
  
  if (this->fPattern != (XMLCh *)0x0) {
    lVar6 = 0;
    do {
      psVar2 = (short *)((long)this->fPattern + lVar6);
      lVar6 = lVar6 + 2;
    } while (*psVar2 != 0);
    lVar6 = lVar6 >> 1;
    if (lVar6 + -1 != 0) {
      if (this->fIgnoreCase == true) {
        if (content == (XMLCh *)0x0) {
          toUpperCase = (XMLCh *)0x0;
        }
        else {
          __n = 0;
          do {
            psVar2 = (short *)((long)content + __n);
            __n = __n + 2;
          } while (*psVar2 != 0);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
          toUpperCase = (XMLCh *)CONCAT44(extraout_var,iVar3);
          memcpy(toUpperCase,content,__n);
        }
        XMLString::upperCase(toUpperCase);
      }
      else {
        toUpperCase = (char16_t *)0x0;
      }
      ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toUpperCase,this->fMemoryManager);
      uVar4 = lVar6 + -1 + start;
      if (uVar4 <= limit) {
        do {
          uVar1 = uVar4 + 1;
          lVar5 = 0;
          while ((content[uVar4 + lVar5 + -1] == this->fPattern[lVar6 + lVar5 + -2] ||
                 (((this->fIgnoreCase & 1U) != 0 &&
                  (this->fUppercasePattern[lVar6 + lVar5 + -2] == toUpperCase[uVar4 + lVar5 + -1])))
                 )) {
            lVar5 = lVar5 + -1;
            if (1 - lVar6 == lVar5) {
              start = (XMLSize_t)(((int)uVar4 - (int)lVar6) + 1);
              goto LAB_00236bde;
            }
          }
          uVar4 = uVar4 + this->fShiftTable
                          [(ulong)(ushort)content[uVar4 + lVar5 + -1] % (ulong)this->fShiftTableLen]
                  + lVar5;
          if (uVar4 <= uVar1) {
            uVar4 = uVar1;
          }
        } while (uVar4 <= limit);
      }
      start = 0xffffffff;
LAB_00236bde:
      ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
    }
  }
  return (int)start;
}

Assistant:

int BMPattern::matches(const XMLCh* const content, XMLSize_t start, XMLSize_t limit) const {

    const XMLSize_t patternLen = XMLString::stringLen(fPattern);
    // Uppercase Content
    XMLCh* ucContent = 0;

    if (patternLen == 0)
        return (int)start;

    if (fIgnoreCase) {
        
        ucContent = XMLString::replicate(content, fMemoryManager);
        XMLString::upperCase(ucContent);
    }

    ArrayJanitor<XMLCh> janUCContent(ucContent, fMemoryManager);

    XMLSize_t index = start + patternLen;

    while (index <= limit) {

        XMLSize_t patternIndex = patternLen;
        XMLSize_t nIndex = index + 1;
        XMLCh ch = 0;

        while (patternIndex > 0) {

            ch = content[--index];

            if (ch != fPattern[--patternIndex]) {

                // No match, so we will break. But first we have
                // to check the ignore case flag. If it is set, then
                // we try to match with the case ignored
                if (!fIgnoreCase ||
                    (fUppercasePattern[patternIndex] != ucContent[index]))
                    break;
            }

            if (patternIndex == 0)
                return (int)index;
        }

        index += fShiftTable[ch % fShiftTableLen] + 1;

        if (index < nIndex)
            index = nIndex;
    }

    return -1;
}